

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

void __thiscall
mkvmuxer::Cluster::Cluster
          (Cluster *this,uint64_t timecode,int64_t cues_pos,uint64_t timecode_scale,
          bool write_last_frame_with_duration,bool fixed_size_timecode)

{
  _Rb_tree_header *p_Var1;
  
  this->blocks_added_ = 0;
  this->finalized_ = false;
  this->fixed_size_timecode_ = fixed_size_timecode;
  this->header_written_ = false;
  this->payload_size_ = 0;
  this->position_for_cues_ = cues_pos;
  this->size_position_ = -1;
  this->timecode_ = timecode;
  this->timecode_scale_ = timecode_scale;
  this->write_last_frame_with_duration_ = write_last_frame_with_duration;
  p_Var1 = &(this->stored_frames_)._M_t._M_impl.super__Rb_tree_header;
  (this->stored_frames_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->stored_frames_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->stored_frames_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->stored_frames_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->stored_frames_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->last_block_timestamp_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->last_block_timestamp_)._M_t._M_impl.super__Rb_tree_header;
  (this->last_block_timestamp_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->last_block_timestamp_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->last_block_timestamp_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->last_block_timestamp_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->writer_ = (IMkvWriter *)0x0;
  return;
}

Assistant:

Cluster::Cluster(uint64_t timecode, int64_t cues_pos, uint64_t timecode_scale,
                 bool write_last_frame_with_duration, bool fixed_size_timecode)
    : blocks_added_(0),
      finalized_(false),
      fixed_size_timecode_(fixed_size_timecode),
      header_written_(false),
      payload_size_(0),
      position_for_cues_(cues_pos),
      size_position_(-1),
      timecode_(timecode),
      timecode_scale_(timecode_scale),
      write_last_frame_with_duration_(write_last_frame_with_duration),
      writer_(NULL) {}